

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::setLayoutItemMargins(QWidgetPrivate *this,int left,int top,int right,int bottom)

{
  QWidget *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QWidgetPrivate *in_RDI;
  int in_R8D;
  QWidget *q;
  
  if ((((in_RDI->leftLayoutItemMargin != in_ESI) || (in_RDI->topLayoutItemMargin != in_EDX)) ||
      (in_RDI->rightLayoutItemMargin != in_ECX)) || (in_RDI->bottomLayoutItemMargin != in_R8D)) {
    this_00 = q_func(in_RDI);
    in_RDI->leftLayoutItemMargin = (char)in_ESI;
    in_RDI->topLayoutItemMargin = (char)in_EDX;
    in_RDI->rightLayoutItemMargin = (char)in_ECX;
    in_RDI->bottomLayoutItemMargin = (char)in_R8D;
    QWidget::updateGeometry(this_00);
  }
  return;
}

Assistant:

void QWidgetPrivate::setLayoutItemMargins(int left, int top, int right, int bottom)
{
    if (leftLayoutItemMargin == left
        && topLayoutItemMargin == top
        && rightLayoutItemMargin == right
        && bottomLayoutItemMargin == bottom)
        return;

    Q_Q(QWidget);
    leftLayoutItemMargin = (signed char)left;
    topLayoutItemMargin = (signed char)top;
    rightLayoutItemMargin = (signed char)right;
    bottomLayoutItemMargin = (signed char)bottom;
    q->updateGeometry();
}